

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

int netaddr_from_socket(netaddr *dst,netaddr_socket *src)

{
  netaddr_socket *src_local;
  netaddr *dst_local;
  
  memset(dst,0,0x10);
  if ((src->v4).sin_family == 2) {
    *(in_addr_t *)dst->_addr = (src->v4).sin_addr.s_addr;
    dst->_prefix_len = ' ';
  }
  else {
    if ((src->v4).sin_family != 10) {
      dst->_type = '\0';
      return -1;
    }
    *(undefined8 *)dst->_addr = *(undefined8 *)(src->v4).sin_zero;
    *(undefined8 *)(dst->_addr + 8) = *(undefined8 *)((long)&(src->v6).sin6_addr.__in6_u + 8);
    dst->_prefix_len = 0x80;
  }
  dst->_type = (uint8_t)(src->v4).sin_family;
  return 0;
}

Assistant:

int
netaddr_from_socket(struct netaddr *dst, const union netaddr_socket *src) {
  memset(dst->_addr, 0, sizeof(dst->_addr));
  if (src->std.sa_family == AF_INET) {
    /* ipv4 */
    memcpy(dst->_addr, &src->v4.sin_addr, 4);
    dst->_prefix_len = 32;
  }
  else if (src->std.sa_family == AF_INET6) {
    /* ipv6 */
    memcpy(dst->_addr, &src->v6.sin6_addr, 16);
    dst->_prefix_len = 128;
  }
  else {
    /* unknown address type */
    dst->_type = AF_UNSPEC;
    return -1;
  }
  dst->_type = (uint8_t)src->std.sa_family;
  return 0;
}